

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>const&>
          (String *__return_storage_ptr__,kj *this,
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params)

{
  kj *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *value;
  CappedArray<char,_17UL> *params_00;
  CappedArray<char,_17UL> local_38;
  kj *local_18;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local;
  
  local_18 = this;
  params_local = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)__return_storage_ptr__;
  this_00 = (kj *)fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>const&>
                            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this);
  toCharSequence<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>const&>(&local_38,this_00,value);
  _::concat<kj::CappedArray<char,17ul>>(__return_storage_ptr__,(_ *)&local_38,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}